

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# seq_word_validation_test.c
# Opt level: O0

void run_test(void)

{
  int iVar1;
  char *pcVar2;
  size_t sVar3;
  socklen_t *__addr_len;
  undefined1 auStack_41948 [8];
  char boolstr [2] [100];
  _Bool ans;
  validator_mq_msg test_msg;
  _Bool expected_ans;
  char expected_ans_tmp [10];
  char buffer [2000];
  void *tmp_err;
  long lStack_40c98;
  _Bool err;
  size_t failed;
  automaton a;
  
  lStack_40c98 = 0;
  tmp_err._7_1_ = 0;
  load_automaton((automaton *)&failed,(_Bool *)((long)&tmp_err + 7));
  while( true ) {
    pcVar2 = fgets(expected_ans_tmp + 2,2000,_stdin);
    if (pcVar2 == (char *)0x0) break;
    sVar3 = strlen(expected_ans_tmp + 2);
    expected_ans_tmp[sVar3 + 1] = '\0';
    pcVar2 = fgets(test_msg.word + 0x3e6,10,_stdin);
    tmp_err._7_1_ = pcVar2 == (char *)0x0;
    test_msg.word[0x3e5] = test_msg.word[0x3e6] != '0';
    boolstr[1][0x60] = '\0';
    boolstr[1][0x61] = '\0';
    boolstr[1][0x62] = '\0';
    boolstr[1][99] = '\x01';
    test_msg._0_4_ = getpid();
    memcpy(&test_msg.accepted,"",0x3e9);
    sVar3 = strlen(expected_ans_tmp + 2);
    memcpy(&test_msg.accepted,expected_ans_tmp + 2,sVar3);
    printf("Validating processed word: %s\n",&test_msg.accepted);
    iVar1 = accept((int)&failed,(sockaddr *)&test_msg.accepted,__addr_len);
    boolstr[1][0x5f] = (byte)iVar1 & 1;
    if (boolstr[1][0x5f] == (test_msg.word[0x3e5] & 1U)) {
      printf("PASSED: %s\n",&test_msg.accepted);
    }
    else {
      lStack_40c98 = lStack_40c98 + 1;
      printf("FAILED TEST: %s - ",&test_msg.accepted);
      memcpy(auStack_41948,"false",200);
      printf("got %s instead of %s. \n",boolstr[(ulong)(boolstr[1][0x5f] & 1) - 1] + 0x5c,
             boolstr[(ulong)(test_msg.word[0x3e5] & 1) - 1] + 0x5c);
    }
    printf("\n");
    expected_ans_tmp[2] = '\0';
  }
  printf("Finished, # of failed cases: %zu.\n",lStack_40c98);
  return;
}

Assistant:

void run_test() {
    automaton a;
    size_t failed = 0;
    bool err = false;
    void *tmp_err;
    load_automaton(&a, &err);

    char buffer[2*WORD_LEN_MAX]; // + '\n' and '\0'
    while(fgets(buffer, sizeof(buffer), stdin)) {
        assert(strlen(buffer) < WORD_LEN_MAX +2);
        assert(buffer[strlen(buffer)-1] == '\n');
        buffer[strlen(buffer)-1] = '\0';

        // load answer for loaded word
        char expected_ans_tmp[10];
        tmp_err = fgets(expected_ans_tmp, 10, stdin);
        err = (tmp_err == NULL);
        bool expected_ans = (bool)(expected_ans_tmp[0]-'0');
        assert(expected_ans==true || expected_ans == false);

        // testing if validator mq holds enough data
        validator_mq_msg test_msg = {false, false, false, true, false, getpid(), ""};
        memcpy(test_msg.word, buffer, strlen(buffer));
        printf("Validating processed word: %s\n", test_msg.word);

        // testing validation result
        bool ans = accept(&a, test_msg.word);
        if(ans != expected_ans) {
            failed++;
            printf("FAILED TEST: %s - ", test_msg.word);
            char boolstr[2][100] = {"false", "true"};
            printf("got %s instead of %s. \n", boolstr[ans], boolstr[expected_ans]);
        } else {
            printf("PASSED: %s\n", test_msg.word);
        }
        printf("\n");
        buffer[0] = '\0';
    }
    printf("Finished, # of failed cases: %zu.\n", failed);
}